

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::MRTCaseGroup::MRTCase::iterate(MRTCase *this)

{
  ostringstream *poVar1;
  ContextInfo *pCVar2;
  RenderContext *renderCtx;
  glUniform4fFunc p_Var3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  GLenum GVar7;
  GLint GVar8;
  GLuint GVar9;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  char *__s;
  mapped_type *pmVar12;
  ostream *poVar13;
  TestError *this_00;
  byte bVar14;
  undefined1 *puVar15;
  GLSLVersion glslVersion;
  char *pcVar16;
  long lVar17;
  bool bVar18;
  GLubyte result [4];
  GLuint vbo;
  GLuint vao;
  string frgSrc;
  FBOSentry fbo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ProgramSources sources;
  ShaderProgram p;
  allocator<char> local_362;
  allocator<char> local_361;
  TestLog *local_360;
  undefined4 local_354;
  value_type local_350;
  value_type local_330;
  string local_310;
  MRTCase *local_2f0;
  string local_2e8;
  FBOSentry local_2c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  undefined1 local_280 [16];
  undefined1 local_270 [104];
  ios_base local_208 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f0;
  undefined1 local_1d0 [208];
  undefined1 local_100 [152];
  GLuint local_68;
  bool local_40;
  Functions *pFVar10;
  
  local_360 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar10 = (Functions *)CONCAT44(extraout_var,iVar6);
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  local_280._0_8_ = "GL_KHR_blend_equation_advanced";
  _Var11 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                     ((pCVar2->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pCVar2->m_extensions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var11._M_current ==
      (pCVar2->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
    return STOP;
  }
  if (iterate()::frgSrcTemplate == '\0') {
    iterate(this);
  }
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0._M_impl.super__Rb_tree_header._M_header;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(this->m_glslVersion);
  local_280._0_8_ = (TestLog *)local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"VERSION_DIRECTIVE","");
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_2b0,(key_type *)local_280);
  pcVar16 = (char *)pmVar12->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar16,(ulong)__s);
  if ((TestLog *)local_280._0_8_ != (TestLog *)local_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(local_270._0_8_ + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100,iterate::frgSrcTemplate,(allocator<char> *)&local_330);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_280,(string *)local_100);
  tcu::StringTemplate::specialize
            (&local_2e8,(StringTemplate *)local_280,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_2b0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_280);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_2c8.m_gl = pFVar10;
  FBOSentry::init(&local_2c8,(EVP_PKEY_CTX *)&DAT_00000004);
  (*pFVar10->drawBuffers)(2,iterate::bufs);
  (*pFVar10->clearColor)(1.0,1.0,1.0,1.0);
  (*pFVar10->clear)(0x4000);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  GetDef2DVtxSrc_abi_cxx11_(&local_310,(glcts *)(ulong)this->m_glslVersion,glslVersion);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,
             (char *)CONCAT44(local_310._M_dataplus._M_p._4_4_,(GLuint)local_310._M_dataplus._M_p),
             &local_361);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,local_2e8._M_dataplus._M_p,&local_362);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_280,0,0xac);
  local_1d0._0_8_ = (pointer)0x0;
  local_1d0[8] = 0;
  local_1d0._9_7_ = 0;
  local_1d0[0x10] = 0;
  local_1d0._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_280,&local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_270 + 8),&local_350);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_100,renderCtx,(ProgramSources *)local_280);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f0);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_280 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_350._M_dataplus._M_p._4_4_,(uint)local_350._M_dataplus._M_p) !=
      &local_350.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_350._M_dataplus._M_p._4_4_,(uint)local_350._M_dataplus._M_p),
                    local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_330._M_dataplus._M_p._4_4_,(GLuint)local_330._M_dataplus._M_p) !=
      &local_330.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_330._M_dataplus._M_p._4_4_,(GLuint)local_330._M_dataplus._M_p),
                    local_330.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_310._M_dataplus._M_p._4_4_,(GLuint)local_310._M_dataplus._M_p) !=
      &local_310.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_310._M_dataplus._M_p._4_4_,(GLuint)local_310._M_dataplus._M_p),
                    local_310.field_2._M_allocated_capacity + 1);
  }
  if (local_40 == false) {
    glu::operator<<(local_360,(ShaderProgram *)local_100);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
               ,0x5cc);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pFVar10->useProgram)(local_68);
  GVar7 = (*pFVar10->getError)();
  glu::checkError(GVar7,"Program failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5d0);
  (*pFVar10->disable)(0xbd0);
  (*pFVar10->enable)(0xbe2);
  (*pFVar10->blendEquation)(0x9297);
  GVar7 = (*pFVar10->getError)();
  glu::checkError(GVar7,"BlendEquation failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5d6);
  p_Var3 = pFVar10->uniform4f;
  GVar8 = (*pFVar10->getUniformLocation)(local_68,"uMultCol");
  (*p_Var3)(GVar8,0.0,0.0,0.0,1.0);
  GVar7 = (*pFVar10->getError)();
  glu::checkError(GVar7,"Uniforms failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5da);
  (*pFVar10->genBuffers)(1,(GLuint *)&local_330);
  (*pFVar10->bindBuffer)(0x8892,(GLuint)local_330._M_dataplus._M_p);
  (*pFVar10->bufferData)(0x8892,0x20,s_pos,0x88e4);
  (*pFVar10->genVertexArrays)(1,(GLuint *)&local_310);
  (*pFVar10->bindVertexArray)((GLuint)local_310._M_dataplus._M_p);
  GVar9 = (*pFVar10->getAttribLocation)(local_68,"aPos");
  (*pFVar10->enableVertexAttribArray)(GVar9);
  (*pFVar10->vertexAttribPointer)(GVar9,2,0x1406,'\0',8,(void *)0x0);
  GVar7 = (*pFVar10->getError)();
  glu::checkError(GVar7,"Attributes failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                  ,0x5e9);
  (*pFVar10->drawArrays)(5,0,4);
  GVar7 = (*pFVar10->getError)();
  puVar15 = s_indices;
  (*pFVar10->drawElements)(4,6,0x1403,s_indices);
  if (GVar7 == 0x502) {
    GVar7 = (*pFVar10->getError)();
    local_354 = (undefined4)CONCAT71((int7)((ulong)puVar15 >> 8),1);
    if (GVar7 == 0x502) goto LAB_00d7c565;
  }
  poVar1 = (ostringstream *)(local_280 + 8);
  local_280._0_8_ = local_360;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"DrawArrays/DrawElements didn\'t produce error.",0x2d);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_208);
  local_354 = 0;
LAB_00d7c565:
  poVar1 = (ostringstream *)(local_280 + 8);
  iVar6 = 0;
  bVar14 = 1;
  bVar5 = true;
  local_2f0 = this;
  do {
    bVar18 = bVar5;
    local_350._M_dataplus._M_p._0_4_ = 0x4030201;
    (*pFVar10->readBuffer)(0x8ce0);
    (*pFVar10->readPixels)(0,0,1,1,0x1908,0x1401,&local_350);
    GVar7 = (*pFVar10->getError)();
    glu::checkError(GVar7,"Read pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x5fb);
    if ((uint)local_350._M_dataplus._M_p != 0xffffffff) {
      local_280._0_8_ = local_360;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Buffer ",7);
      std::ostream::operator<<(poVar1,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"contents changed: ",0x12);
      uVar4 = (uint)local_350._M_dataplus._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
      poVar13 = (ostream *)std::ostream::operator<<(poVar1,uVar4 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar4 >> 8 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar4 >> 0x10 & 0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,uVar4 >> 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," expected:",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
      poVar13 = (ostream *)std::ostream::operator<<(poVar1,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,0xff);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_208);
      bVar14 = 0;
    }
    iVar6 = 1;
    bVar5 = false;
  } while (bVar18);
  (*pFVar10->deleteVertexArrays)(1,(GLuint *)&local_310);
  (*pFVar10->deleteBuffers)(1,(GLuint *)&local_330);
  bVar14 = (byte)local_354 & bVar14;
  pcVar16 = "Fail";
  if (bVar14 != 0) {
    pcVar16 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_2f0->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar14 ^ 1),
             pcVar16);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  FBOSentry::~FBOSentry(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_2b0);
  return STOP;
}

Assistant:

MRTCaseGroup::MRTCase::IterateResult MRTCaseGroup::MRTCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	static const char* frgSrcTemplateArray = "${VERSION_DIRECTIVE}\n"
											 "#extension GL_KHR_blend_equation_advanced : require\n"
											 "\n"
											 "precision highp float;\n"
											 "layout (blend_support_multiply) out;\n"
											 "layout (location = 0) out vec4 oCol[2];\n"
											 "\n"
											 "uniform vec4 uMultCol;\n"
											 "\n"
											 "void main (void) {\n"
											 "   oCol[0] = uMultCol;\n"
											 "   oCol[1] = uMultCol;\n"
											 "}\n";

	static const char* frgSrcTemplateSeparate = "${VERSION_DIRECTIVE}\n"
												"#extension GL_KHR_blend_equation_advanced : require\n"
												"\n"
												"precision highp float;\n"
												"layout (blend_support_multiply) out;\n"
												"layout (location = 0) out vec4 oCol0;\n"
												"layout (location = 1) out vec4 oCol1;\n"
												"\n"
												"uniform vec4 uMultCol;\n"
												"\n"
												"void main (void) {\n"
												"   oCol0 = uMultCol;\n"
												"   oCol1 = uMultCol;\n"
												"}\n";

	static const char* frgSrcTemplate = m_declarationType == ARRAY ? frgSrcTemplateArray : frgSrcTemplateSeparate;

	std::map<std::string, std::string> args;
	args["VERSION_DIRECTIVE"] = glu::getGLSLVersionDeclaration(m_glslVersion);
	std::string frgSrc		  = tcu::StringTemplate(frgSrcTemplate).specialize(args);

	FBOSentry fbo(gl, 4, 4, GL_RGBA8, GL_RGBA8);

	static const glw::GLenum bufs[2] = { GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1 };
	gl.drawBuffers(2, bufs);

	// Clear buffers to white.
	gl.clearColor(1.f, 1.f, 1.f, 1.f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Setup program.
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}

	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);
	gl.blendEquation(GL_DARKEN_KHR);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	// Multiply with zero.
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uMultCol"), 0.f, 0.f, 0.f, 1.00f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniforms failed");

	// Set vertex buffer
	glw::GLuint vbo;
	gl.genBuffers(1, &vbo);
	gl.bindBuffer(GL_ARRAY_BUFFER, vbo);
	gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_pos), s_pos, GL_STATIC_DRAW);

	// Set vertices.
	glw::GLuint vao;
	gl.genVertexArrays(1, &vao);
	gl.bindVertexArray(vao);
	glw::GLint loc = gl.getAttribLocation(p.getProgram(), "aPos");
	gl.enableVertexAttribArray(loc);
	gl.vertexAttribPointer(loc, 2, GL_FLOAT, GL_FALSE, 8, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	bool errorOk = (gl.getError() == GL_INVALID_OPERATION);

	gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, s_indices);
	errorOk = errorOk && (gl.getError() == GL_INVALID_OPERATION);

	if (!errorOk)
		log << TestLog::Message << "DrawArrays/DrawElements didn't produce error." << TestLog::EndMessage;

	// Expect unaltered destination pixels.
	bool contentsOk = true;
	for (int i = 0; i < 2; i++)
	{
		glw::GLubyte result[4] = { 1, 2, 3, 4 };
		gl.readBuffer(bufs[0]);
		gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, result);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
		if (tcu::RGBA::fromBytes(result) != tcu::RGBA::white())
		{
			contentsOk = false;
			log << TestLog::Message << "Buffer " << i << " "
				<< "contents changed: " << tcu::RGBA::fromBytes(result) << " expected:" << tcu::RGBA::white()
				<< TestLog::EndMessage;
		}
	}

	gl.deleteVertexArrays(1, &vao);
	gl.deleteBuffers(1, &vbo);

	bool pass = errorOk && contentsOk;
	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");
	return STOP;
}